

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalObject.cpp
# Opt level: O1

Var Js::GlobalObject::EntryEscape(RecyclableObject *function,CallInfo callInfo,...)

{
  char16 *pcVar1;
  ScriptContext *pSVar2;
  code *pcVar3;
  bool bVar4;
  charcount_t cVar5;
  uint uVar6;
  undefined4 *puVar7;
  Var aValue;
  CompoundString *toString;
  char16 *pcVar8;
  char16 c;
  int in_stack_00000010;
  JavascriptString *local_50;
  JavascriptString *src;
  ArgumentReader args;
  CallInfo callInfo_local;
  
  pSVar2 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  args.super_Arguments.Values = (Type)callInfo;
  ThreadContext::ProbeStack(pSVar2->threadContext,0xc00,pSVar2,(PVOID)0x0);
  if (in_stack_00000010 != (int)args.super_Arguments.Values) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/GlobalObject.cpp"
                                ,0x563,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar4) goto LAB_00b5bd01;
    *puVar7 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  src = (JavascriptString *)args.super_Arguments.Values;
  ArgumentReader::AdjustArguments((ArgumentReader *)&src,(CallInfo *)&args.super_Arguments.Values);
  pSVar2 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)args.super_Arguments.Values & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/GlobalObject.cpp"
                                ,0x566,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar4) {
LAB_00b5bd01:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar7 = 0;
  }
  if (((ulong)src & 0xfffffe) == 0) {
    toString = (CompoundString *)
               StringCache::GetUndefinedDisplay
                         (&((pSVar2->super_ScriptContextBase).javascriptLibrary)->stringCache);
  }
  else {
    EnterPinnedScope(&local_50);
    aValue = Arguments::operator[]((Arguments *)&src,1);
    local_50 = JavascriptConversion::ToString(aValue,pSVar2);
    cVar5 = JavascriptString::GetLength(local_50);
    toString = CompoundString::NewWithCharCapacity
                         (cVar5,(pSVar2->super_ScriptContextBase).javascriptLibrary);
    pcVar8 = JavascriptString::GetString(local_50);
    cVar5 = JavascriptString::GetLength(local_50);
    pcVar1 = pcVar8 + cVar5;
    for (; pcVar8 < pcVar1; pcVar8 = pcVar8 + 1) {
      c = *pcVar8;
      if ((ushort)c < 0x100) {
        if ((_grfbitEscape[(ushort)c >> 3] >> ((ushort)c & 7) & 1) != 0) {
          CompoundString::AppendChars(toString,L'%');
          uVar6 = (uint)((ushort)c >> 4);
          goto LAB_00b5bca3;
        }
      }
      else {
        CompoundString::AppendGeneric<3u,Js::CompoundString>
                  ((char16 (*) [3])0x11c3762,true,toString,true);
        CompoundString::AppendChars(toString,(short)"0123456789ABCDEF"[(ushort)c >> 0xc]);
        CompoundString::AppendChars(toString,(short)"0123456789ABCDEF"[(ushort)c >> 8 & 0xf]);
        uVar6 = (ushort)c >> 4 & 0xf;
LAB_00b5bca3:
        CompoundString::AppendChars(toString,(short)"0123456789ABCDEF"[uVar6]);
        c = (char16)"0123456789ABCDEF"[(ushort)c & 0xf];
      }
      CompoundString::AppendChars(toString,c);
    }
    LeavePinnedScope();
  }
  return toString;
}

Assistant:

Var GlobalObject::EntryEscape(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));

        if (args.Info.Count <= 1)
        {
            return scriptContext->GetLibrary()->GetUndefinedDisplayString();
        }

        CompoundString * bs = nullptr;
        ENTER_PINNED_SCOPE(JavascriptString, src);
        src = JavascriptConversion::ToString(args[1], scriptContext);
        bs = CompoundString::NewWithCharCapacity(src->GetLength(), scriptContext->GetLibrary());

        char16 chw;
        char16 * pchSrc;
        char16 * pchLim;

        const char _rgchHex[] = "0123456789ABCDEF";

        pchSrc = const_cast<char16 *>(src->GetString());
        pchLim = pchSrc + src->GetLength();
        while (pchSrc < pchLim)
        {
            chw = *pchSrc++;

            if (0 != (chw & 0xFF00))
            {
                bs->AppendChars(_u("%u"));
                bs->AppendChars(static_cast<char16>(_rgchHex[(chw >> 12) & 0x0F]));
                bs->AppendChars(static_cast<char16>(_rgchHex[(chw >> 8) & 0x0F]));
                bs->AppendChars(static_cast<char16>(_rgchHex[(chw >> 4) & 0x0F]));
                bs->AppendChars(static_cast<char16>(_rgchHex[chw & 0x0F]));
            }
            else if (_grfbitEscape[chw >> 3] & (1 << (chw & 7)))
            {
                // Escape the byte.
                bs->AppendChars(_u('%'));
                bs->AppendChars(static_cast<char16>(_rgchHex[chw >> 4]));
                bs->AppendChars(static_cast<char16>(_rgchHex[chw & 0x0F]));
            }
            else
            {
                bs->AppendChars(chw);
            }
        }
        LEAVE_PINNED_SCOPE();   // src

        return bs;
    }